

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

VariableDimensionSyntax * __thiscall slang::parsing::Parser::parseDimension(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  QueueDimensionSpecifierSyntax *specifier;
  ExpressionSyntax *expr;
  ColonExpressionClauseSyntax *maxSizeClause;
  SelectorSyntax *selector;
  VariableDimensionSyntax *pVVar3;
  Token openBracket;
  Token TVar4;
  Token colon;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
  if (!bVar1) {
    return (VariableDimensionSyntax *)0x0;
  }
  openBracket = ParserBase::consume(&this->super_ParserBase);
  TVar4 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar4.kind;
  if (TVar2 == CloseBracket) {
    specifier = (QueueDimensionSpecifierSyntax *)0x0;
  }
  else if (TVar2 == Dollar) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
    if (bVar1) {
      colon = ParserBase::consume(&this->super_ParserBase);
      expr = parseExpression(this);
      maxSizeClause = slang::syntax::SyntaxFactory::colonExpressionClause(&this->factory,colon,expr)
      ;
    }
    else {
      maxSizeClause = (ColonExpressionClauseSyntax *)0x0;
    }
    specifier = slang::syntax::SyntaxFactory::queueDimensionSpecifier
                          (&this->factory,TVar4,maxSizeClause);
  }
  else if (TVar2 == Star) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    specifier = (QueueDimensionSpecifierSyntax *)
                slang::syntax::SyntaxFactory::wildcardDimensionSpecifier(&this->factory,TVar4);
  }
  else {
    selector = parseElementSelector(this);
    specifier = (QueueDimensionSpecifierSyntax *)
                slang::syntax::SyntaxFactory::rangeDimensionSpecifier(&this->factory,selector);
  }
  TVar4 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
  pVVar3 = slang::syntax::SyntaxFactory::variableDimension
                     (&this->factory,openBracket,&specifier->super_DimensionSpecifierSyntax,TVar4);
  return pVVar3;
}

Assistant:

VariableDimensionSyntax* Parser::parseDimension() {
    if (!peek(TokenKind::OpenBracket))
        return nullptr;

    auto openBracket = consume();

    DimensionSpecifierSyntax* specifier = nullptr;
    switch (peek().kind) {
        case TokenKind::CloseBracket:
            // empty specifier
            break;
        case TokenKind::Star:
            specifier = &factory.wildcardDimensionSpecifier(consume());
            break;
        case TokenKind::Dollar: {
            auto dollar = consume();

            ColonExpressionClauseSyntax* colonExpressionClause = nullptr;
            if (peek(TokenKind::Colon)) {
                auto colon = consume();
                colonExpressionClause = &factory.colonExpressionClause(colon, parseExpression());
            }
            specifier = &factory.queueDimensionSpecifier(dollar, colonExpressionClause);
            break;
        }
        default: {
            auto selector = parseElementSelector();
            SLANG_ASSERT(selector);
            specifier = &factory.rangeDimensionSpecifier(*selector);
            break;
        }
    }

    auto closeBracket = expect(TokenKind::CloseBracket);
    return &factory.variableDimension(openBracket, specifier, closeBracket);
}